

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absVta.c
# Opt level: O1

Vta_Man_t * Vga_ManStart(Gia_Man_t *pGia,Abs_Par_t *pPars)

{
  uint uVar1;
  uint uVar2;
  Vta_Man_t *pVVar3;
  Vta_Obj_t *pVVar4;
  int *piVar5;
  Vec_Int_t *pVVar6;
  Vec_Bit_t *pVVar7;
  int *__s;
  Vec_Ptr_t *pVVar8;
  void **ppvVar9;
  sat_solver2 *psVar10;
  Vec_Set_t *pVVar11;
  word **ppwVar12;
  word *pwVar13;
  uint uVar14;
  int iVar15;
  
  pVVar3 = (Vta_Man_t *)calloc(1,0xa8);
  pVVar3->pGia = pGia;
  pVVar3->pPars = pPars;
  pVVar3->nObjsAlloc = 0x40000;
  pVVar4 = (Vta_Obj_t *)calloc(0x40000,0x10);
  pVVar3->pObjs = pVVar4;
  pVVar3->nObjs = 1;
  uVar14 = 0x7ffff;
  while( true ) {
    do {
      uVar2 = uVar14 + 1;
      uVar1 = uVar14 & 1;
      uVar14 = uVar2;
    } while (uVar1 != 0);
    if (uVar2 < 9) break;
    iVar15 = 5;
    while (uVar2 % (iVar15 - 2U) != 0) {
      uVar1 = iVar15 * iVar15;
      iVar15 = iVar15 + 2;
      if (uVar2 < uVar1) goto LAB_0059f0df;
    }
  }
LAB_0059f0df:
  pVVar3->nBins = uVar2;
  piVar5 = (int *)calloc((long)(int)uVar2,4);
  pVVar3->pBins = piVar5;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  pVVar6->nCap = 0x3f5;
  pVVar6->nSize = 0;
  piVar5 = (int *)malloc(0xfd4);
  pVVar6->pArray = piVar5;
  pVVar3->vOrder = pVVar6;
  uVar14 = pGia->nObjs;
  uVar2 = uVar14;
  if (1 < (ulong)(long)(int)uVar14) {
    uVar2 = uVar14 - 1;
    if (uVar2 == 0) {
      uVar2 = 0;
    }
    else {
      uVar1 = 0x1f;
      if (uVar2 != 0) {
        for (; uVar2 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      uVar2 = (uVar1 ^ 0xffffffe0) + 0x21;
    }
  }
  pVVar3->nObjBits = uVar2;
  uVar2 = ~(-1 << ((byte)uVar2 & 0x1f));
  pVVar3->nObjMask = uVar2;
  if ((int)uVar14 <= (int)uVar2) {
    pVVar3->nWords = 1;
    pVVar6 = (Vec_Int_t *)malloc(0x10);
    uVar2 = 0x10;
    if (0xe < uVar14 - 1) {
      uVar2 = uVar14;
    }
    pVVar6->nSize = 0;
    pVVar6->nCap = uVar2;
    if (uVar2 == 0) {
      piVar5 = (int *)0x0;
    }
    else {
      piVar5 = (int *)malloc((long)(int)uVar2 << 2);
    }
    pVVar6->pArray = piVar5;
    pVVar6->nSize = uVar14;
    __s = (int *)0x0;
    memset(piVar5,0,(long)(int)uVar14 << 2);
    pVVar3->vSeens = pVVar6;
    iVar15 = (((int)uVar14 >> 5) + 1) - (uint)((uVar14 & 0x1f) == 0);
    pVVar7 = (Vec_Bit_t *)malloc(0x10);
    pVVar7->nSize = 0;
    pVVar7->nCap = iVar15 * 0x20;
    if (iVar15 != 0) {
      __s = (int *)malloc((long)iVar15 * 4);
    }
    pVVar7->pArray = __s;
    pVVar7->nSize = iVar15 * 0x20;
    memset(__s,0,(long)iVar15 << 2);
    pVVar3->vSeenGla = pVVar7;
    pVVar3->nSeenGla = 1;
    pVVar3->nSeenAll = 1;
    pVVar8 = (Vec_Ptr_t *)malloc(0x10);
    pVVar8->nCap = 100;
    pVVar8->nSize = 0;
    ppvVar9 = (void **)malloc(800);
    pVVar8->pArray = ppvVar9;
    pVVar3->vCores = pVVar8;
    psVar10 = sat_solver2_new();
    pVVar3->pSat = psVar10;
    pVVar11 = (Vec_Set_t *)calloc(1,0x20);
    pVVar11->nPageSize = 0;
    pVVar11->uPageMask = 0;
    pVVar11->nEntries = 0;
    pVVar11->iPage = 0;
    pVVar11->iPageS = 0;
    pVVar11->nPagesAlloc = 0;
    pVVar11->pPages = (word **)0x0;
    pVVar11->nPageSize = 0x14;
    pVVar11->uPageMask = 0xfffff;
    pVVar11->nPagesAlloc = 0x100;
    ppwVar12 = (word **)calloc(0x100,8);
    pVVar11->pPages = ppwVar12;
    pwVar13 = (word *)malloc(0x800000);
    *ppwVar12 = pwVar13;
    *(undefined4 *)pwVar13 = 0xffffffff;
    *(undefined4 *)((long)pwVar13 + 4) = 0xffffffff;
    *(undefined4 *)(pwVar13 + 1) = 0xffffffff;
    *(undefined4 *)((long)pwVar13 + 0xc) = 0xffffffff;
    *pwVar13 = 2;
    psVar10->pPrf1 = pVVar11;
    iVar15 = pPars->nLearnedStart;
    psVar10->nLearntStart = iVar15;
    psVar10->nLearntDelta = pPars->nLearnedDelta;
    psVar10->nLearntRatio = pPars->nLearnedPerce;
    psVar10->nLearntMax = iVar15;
    if (pGia->vObjClasses != (Vec_Int_t *)0x0) {
      pVVar8 = Gia_VtaAbsToFrames(pGia->vObjClasses);
      pVVar3->vFrames = pVVar8;
      pVVar6 = (Vec_Int_t *)malloc(0x10);
      pVVar6->nCap = 1000;
      pVVar6->nSize = 0;
      piVar5 = (int *)malloc(4000);
      pVVar6->pArray = piVar5;
      pVVar3->vAddedNew = pVVar6;
      return pVVar3;
    }
    __assert_fail("pGia->vObjClasses != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absVta.c"
                  ,0x3f8,"Vta_Man_t *Vga_ManStart(Gia_Man_t *, Abs_Par_t *)");
  }
  __assert_fail("Gia_ManObjNum(pGia) <= (int)p->nObjMask",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absVta.c"
                ,999,"Vta_Man_t *Vga_ManStart(Gia_Man_t *, Abs_Par_t *)");
}

Assistant:

Vta_Man_t * Vga_ManStart( Gia_Man_t * pGia, Abs_Par_t * pPars )
{
    Vta_Man_t * p;
    p = ABC_CALLOC( Vta_Man_t, 1 );
    p->pGia        = pGia;
    p->pPars       = pPars;
    // internal data
    p->nObjsAlloc  = (1 << 18);
    p->pObjs       = ABC_CALLOC( Vta_Obj_t, p->nObjsAlloc );
    p->nObjs       = 1;
    p->nBins       = Abc_PrimeCudd( 2*p->nObjsAlloc );
    p->pBins       = ABC_CALLOC( int, p->nBins );
    p->vOrder      = Vec_IntAlloc( 1013 );
    // abstraction
    p->nObjBits    = Abc_Base2Log( Gia_ManObjNum(pGia) );
    p->nObjMask    = (1 << p->nObjBits) - 1;
    assert( Gia_ManObjNum(pGia) <= (int)p->nObjMask );
    p->nWords      = 1;
    p->vSeens      = Vec_IntStart( Gia_ManObjNum(pGia) * p->nWords );
    p->vSeenGla    = Vec_BitStart( Gia_ManObjNum(pGia) );
    p->nSeenGla    = 1;
    p->nSeenAll    = 1;
    // other data
    p->vCores      = Vec_PtrAlloc( 100 );
    p->pSat        = sat_solver2_new();
    p->pSat->pPrf1 = Vec_SetAlloc( 20 );
//    p->pSat->fVerbose = p->pPars->fVerbose;
//    sat_solver2_set_learntmax( p->pSat, pPars->nLearnedMax );
    p->pSat->nLearntStart = p->pPars->nLearnedStart;
    p->pSat->nLearntDelta = p->pPars->nLearnedDelta;
    p->pSat->nLearntRatio = p->pPars->nLearnedPerce;
    p->pSat->nLearntMax   = p->pSat->nLearntStart;
    // start the abstraction
    assert( pGia->vObjClasses != NULL );
    p->vFrames = Gia_VtaAbsToFrames( pGia->vObjClasses );
    p->vAddedNew   = Vec_IntAlloc( 1000 );
    return p;
}